

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

long __thiscall Arcflow::go(Arcflow *this)

{
  int it_00;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  int *piVar6;
  pointer ppVar7;
  long lVar8;
  runtime_error *this_00;
  reference pvVar9;
  reference piVar10;
  const_reference pvVar11;
  uint *puVar12;
  vector<int,_std::allocator<int>_> *in_RSI;
  pair<std::_Rb_tree_const_iterator<Arc>,_bool> pVar13;
  int local_2f4;
  Arc local_2c4;
  _Base_ptr local_2b8;
  undefined1 local_2b0;
  Arc local_2a4;
  int local_298;
  int local_294;
  int iu;
  int local_28c;
  undefined1 local_288 [4];
  int d_2;
  vector<int,_std::allocator<int>_> *local_270;
  vector<int,_std::allocator<int>_> *v;
  int local_250;
  int local_24c;
  int iv;
  int d_1;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> *w;
  vector<int,_std::allocator<int>_> sv_1;
  char local_1f8 [8];
  char _error_msg_ [256];
  undefined1 local_e0 [8];
  vector<int,_std::allocator<int>_> sv;
  iterator iStack_c0;
  int up;
  _Self local_b8;
  iterator itr;
  vector<int,_std::allocator<int>_> key;
  int local_90;
  value_type_conflict local_8c;
  int d;
  int t;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> maxw;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> mu;
  vector<int,_std::allocator<int>_> valid_opts;
  int ic;
  int it;
  vector<int,_std::allocator<int>_> *su_local;
  Arcflow *this_local;
  
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)(this->inst).ndims);
  it_00 = *pvVar3;
  if (((this->inst).binary & 1U) == 0) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (in_RSI,(long)((this->inst).ndims + 1));
    local_2f4 = *pvVar3;
  }
  else {
    local_2f4 = 0;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_58,&this->max_label);
  iVar2 = (this->inst).ndims;
  t = 0;
  std::allocator<int>::allocator((allocator<int> *)((long)&d + 3));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,(long)iVar2,&t,
             (allocator<int> *)((long)&d + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&d + 3));
  for (local_8c = 0; local_8c < (this->inst).nbtypes; local_8c = local_8c + 1) {
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&(this->inst).Ws,(long)local_8c);
    bVar1 = is_valid(this,in_RSI,pvVar4);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 &mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,&local_8c);
      for (local_90 = 0; local_90 < (this->inst).ndims; local_90 = local_90 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_58,(long)local_90);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(this->inst).Ws,(long)local_8c);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_90);
        piVar6 = std::min<int>(pvVar3,pvVar5);
        iVar2 = *piVar6;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_58,(long)local_90);
        *pvVar3 = iVar2;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_80,(long)local_90);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(this->inst).Ws,(long)local_8c);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_90);
        piVar6 = std::max<int>(pvVar3,pvVar5);
        iVar2 = *piVar6;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_80,(long)local_90);
        *pvVar3 = iVar2;
      }
    }
  }
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)
                     &mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    this_local._4_4_ = 0xffffffff;
    goto LAB_00119a29;
  }
  bVar1 = is_full(this,in_RSI,(vector<int,_std::allocator<int>_> *)local_80);
  if (bVar1) {
    this_local._4_4_ = NodeSet::get_index(&this->NS,(vector<int,_std::allocator<int>_> *)local_58);
    goto LAB_00119a29;
  }
  lift_state(this,(vector<int,_std::allocator<int>_> *)
                  &mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage,in_RSI,it_00,local_2f4);
  hash((vector<int,_std::allocator<int>_> *)&itr,this,in_RSI);
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
       ::find(&this->dp,(key_type *)&itr);
  iStack_c0 = std::
              map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
              ::end(&this->dp);
  bVar1 = std::operator!=(&local_b8,&stack0xffffffffffffff40);
  if (bVar1) {
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>::
             operator->(&local_b8);
    this_local._4_4_ = ppVar7->second;
  }
  else {
    sv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = -1;
    if (it_00 + 1 < (this->inst).nsizes) {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_e0,in_RSI);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_e0,(long)(this->inst).ndims);
      *pvVar3 = it_00 + 1;
      if (((this->inst).binary & 1U) == 0) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_e0,
                            (long)((this->inst).ndims + 1));
        *pvVar3 = 0;
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)(_error_msg_ + 0xf8),
                 (vector<int,_std::allocator<int>_> *)local_e0);
      lVar8 = go(this);
      sv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = (int)lVar8;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)(_error_msg_ + 0xf8));
      if (sv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ == -1) {
        snprintf(local_1f8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "up != -1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                 ,0x138);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,local_1f8);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      NodeSet::get_label((vector<int,_std::allocator<int>_> *)
                         &sv_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,&this->NS,
                         sv.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)local_58,
                 (vector<int,_std::allocator<int>_> *)
                 &sv_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &sv_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e0)
      ;
    }
    if ((it_00 < (this->inst).nsizes) &&
       (pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->max_rep,(long)it_00),
       local_2f4 < *pvVar3)) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&w,in_RSI)
      ;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->weights,(long)it_00);
      pvVar9 = std::vector<Item,_std::allocator<Item>_>::operator[](&this->sitems,(long)it_00);
      __end2 = std::vector<int,_std::allocator<int>_>::begin(&pvVar9->nonzero);
      _iv = std::vector<int,_std::allocator<int>_>::end(&pvVar9->nonzero);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&iv), bVar1) {
        piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end2);
        local_24c = *piVar10;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_24c);
        iVar2 = *pvVar11;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&w,(long)local_24c);
        *pvVar3 = iVar2 + *pvVar3;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&w,(long)local_24c);
        iVar2 = *pvVar3;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_80,(long)local_24c);
        if (*pvVar3 < iVar2) {
          this_local._4_4_ =
               NodeSet::get_index(&this->NS,(vector<int,_std::allocator<int>_> *)local_58);
          puVar12 = (uint *)std::
                            map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                            ::operator[](&this->dp,(key_type *)&itr);
          *puVar12 = this_local._4_4_;
          bVar1 = true;
          goto LAB_0011998a;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2);
      }
      if (((this->inst).binary & 1U) == 0) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->max_rep,(long)it_00);
        if (local_2f4 + 1 < *pvVar3) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&w,(long)(this->inst).ndims);
          *pvVar3 = it_00;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&w,(long)((this->inst).ndims + 1)
                             );
          *pvVar3 = local_2f4 + 1;
        }
        else {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&w,(long)(this->inst).ndims);
          *pvVar3 = it_00 + 1;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&w,(long)((this->inst).ndims + 1)
                             );
          *pvVar3 = 0;
        }
      }
      else {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&w,(long)(this->inst).ndims);
        *pvVar3 = it_00 + 1;
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&v,(vector<int,_std::allocator<int>_> *)&w);
      lVar8 = go(this);
      iVar2 = (int)lVar8;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&v);
      local_250 = iVar2;
      if (iVar2 != -1) {
        NodeSet::get_label((vector<int,_std::allocator<int>_> *)local_288,&this->NS,iVar2);
        local_270 = (vector<int,_std::allocator<int>_> *)local_288;
        for (local_28c = 0; local_28c < (this->inst).ndims; local_28c = local_28c + 1) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_58,(long)local_28c);
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](local_270,(long)local_28c);
          iVar2 = *pvVar11;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_28c);
          iu = iVar2 - *pvVar11;
          piVar6 = std::min<int>(pvVar3,&iu);
          iVar2 = *piVar6;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_58,(long)local_28c);
          *pvVar3 = iVar2;
        }
        if (((this->inst).binary & 1U) != 0) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_58,(long)(this->inst).ndims
                             );
          local_294 = it_00 + 1;
          piVar6 = std::min<int>(pvVar3,&local_294);
          iVar2 = *piVar6;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_58,(long)(this->inst).ndims
                             );
          *pvVar3 = iVar2;
        }
        local_298 = NodeSet::get_index(&this->NS,(vector<int,_std::allocator<int>_> *)local_58);
        Arc::Arc(&local_2a4,&local_298,&local_250,it_00);
        pVar13 = std::set<Arc,_std::less<Arc>,_std::allocator<Arc>_>::insert(&this->AS,&local_2a4);
        local_2b8 = (_Base_ptr)pVar13.first._M_node;
        local_2b0 = pVar13.second;
        if ((sv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ != -1) &&
           (local_298 !=
            sv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_)) {
          Arc::Arc(&local_2c4,&local_298,
                   (int *)((long)&sv.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 4),this->LOSS);
          std::set<Arc,_std::less<Arc>,_std::allocator<Arc>_>::insert(&this->AS,&local_2c4);
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_288);
      }
      bVar1 = false;
LAB_0011998a:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&w);
      if (bVar1) goto LAB_00119a0d;
    }
    this_local._4_4_ = NodeSet::get_index(&this->NS,(vector<int,_std::allocator<int>_> *)local_58);
    puVar12 = (uint *)std::
                      map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                      ::operator[](&this->dp,(key_type *)&itr);
    *puVar12 = this_local._4_4_;
  }
LAB_00119a0d:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&itr);
LAB_00119a29:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return (ulong)this_local._4_4_;
}

Assistant:

int Arcflow::go(std::vector<int> su) {
	int it = su[inst.ndims];
	int ic = inst.binary ? 0 : su[inst.ndims + 1];
	std::vector<int> valid_opts;
	std::vector<int> mu(max_label);
	std::vector<int> maxw(inst.ndims, 0);
	for (int t = 0; t < inst.nbtypes; t++) {
		if (is_valid(su, inst.Ws[t])) {
			valid_opts.push_back(t);
			for (int d = 0; d < inst.ndims; d++) {
				mu[d] = std::min(mu[d], inst.Ws[t][d]);
				maxw[d] = std::max(maxw[d], inst.Ws[t][d]);
			}
		}
	}
	if (valid_opts.empty()) {  // if invalid
		return -1;
	} else if (is_full(su, maxw)) {  // if full
		return NS.get_index(mu);
	} else {
		lift_state(valid_opts, su, it, ic);
	}

	// const vector<int> key(su);
	const std::vector<int> key(hash(su));
	std::map<std::vector<int>, int>::iterator itr = dp.find(key);
	if (itr != dp.end()) {
		return itr->second;
	}

	int up = -1;
	if (it + 1 < inst.nsizes) {
		std::vector<int> sv(su);
		sv[inst.ndims] = it + 1;
		if (!inst.binary) {
			sv[inst.ndims + 1] = 0;
		}
		up = go(sv);
		throw_assert(up != -1);
		mu = NS.get_label(up);
	}

	if (it < inst.nsizes && ic < max_rep[it]) {
		std::vector<int> sv(su);
		const std::vector<int> &w = weights[it];
		for (int d : sitems[it].nonzero) {
			sv[d] += w[d];
			if (sv[d] > maxw[d]) {  // if invalid
				return dp[key] = NS.get_index(mu);
			}
		}

		if (inst.binary) {
			sv[inst.ndims] = it + 1;
		} else {
			if (ic + 1 < max_rep[it]) {
				sv[inst.ndims] = it;
				sv[inst.ndims + 1] = ic + 1;
			} else {
				sv[inst.ndims] = it + 1;
				sv[inst.ndims + 1] = 0;
			}
		}

		int iv = go(sv);

		if (iv != -1) {
			const std::vector<int> &v = NS.get_label(iv);
			for (int d = 0; d < inst.ndims; d++) {
				mu[d] = std::min(mu[d], v[d] - w[d]);
			}
			if (inst.binary) {
				mu[inst.ndims] = std::min(mu[inst.ndims], it + 1);
			}
			int iu = NS.get_index(mu);
			AS.insert(Arc(iu, iv, it));
			if (up != -1 && iu != up) {
				AS.insert(Arc(iu, up, LOSS));
			}
		}
	}

	return dp[key] = NS.get_index(mu);
}